

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::internal::UnaryOpSquaredNorm::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,UnaryOpSquaredNorm *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *u,int param_2)

{
  size_type sVar1;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  reference pvVar2;
  RealScalar RVar3;
  ulong local_60;
  size_t i;
  allocator<double> local_41;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> result;
  int param_2_local;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *u_local;
  UnaryOpSquaredNorm *this_local;
  
  result.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = param_2;
  sVar1 = std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(u);
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,sVar1,&local_41);
  std::allocator<double>::~allocator(&local_41);
  local_60 = 0;
  while( true ) {
    sVar1 = std::
            vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(u);
    if (sVar1 <= local_60) break;
    this_00 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](u,local_60);
    RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::squaredNorm(this_00);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_40,local_60);
    *pvVar2 = RVar3;
    local_60 = local_60 + 1;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_40);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S, R, C, O, MR, MC>>& u,
                  int /*unused*/) const {
    std::vector<double> result(u.size());
    if constexpr (R != Eigen::Dynamic && C != Eigen::Dynamic) {  // NOLINT
      static_assert(
          R > 0 && C > 0,
          "squaredNorm only supported for matrices with at least 1 row "
          "and column");
      if constexpr (C == 1) {  // NOLINT
        const Eigen::Map<const Eigen::Matrix<S, R, Eigen::Dynamic>> um(
            &u[0](0, 0), R, u.size());
        Eigen::Map<Eigen::Matrix<S, 1, Eigen::Dynamic>> rm(result.data(), 1,
                                                           u.size());
        rm = um.cwiseAbs2().colwise().sum();
      } else if constexpr (R == 1) {  // NOLINT
        Eigen::Map<const Eigen::Matrix<S, Eigen::Dynamic, C, Eigen::RowMajor>>
            um(&u[0](0, 0), u.size(), C);
        Eigen::Map<Eigen::Matrix<S, Eigen::Dynamic, 1>> rm(result.data(),
                                                           u.size(), 1);
        rm = um.cwiseAbs2().rowwise().sum();
      }
    } else {  // NOLINT
      for (std::size_t i = 0; i < u.size(); ++i) {
        result[i] = u[i].squaredNorm();
      }
    }
    return result;
  }